

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O3

int __thiscall TasGrid::RuleWavelet::getParent(RuleWavelet *this,int point)

{
  int iVar1;
  
  if (this->order == 1) {
    iVar1 = -1;
    if ((2 < point) && (iVar1 = -2, 4 < (uint)point)) {
LAB_001c48d2:
      return point + 1U >> 1;
    }
  }
  else {
    iVar1 = -1;
    if ((4 < point) && (iVar1 = -2, 8 < (uint)point)) goto LAB_001c48d2;
  }
  return iVar1;
}

Assistant:

int RuleWavelet::getParent(int point) const{
    // Returns the parent of a given node.
    // Miro: this is a hack, -1 indicates no parent, >= 0 indicates the parent, -2 indicates all nodes on level 0
    if (order == 1){
        if(point <= 2) return -1;
        if(point <= 4) return -2;
    }else{
        if(point <= 4) return -1;
        if(point <= 8) return -2;
    }
    return (point+1)/2;
}